

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgm2wav.cpp
# Opt level: O0

void frames_to_little_endian(UINT8 *data,uint frame_count)

{
  uint local_18;
  uint i;
  uint frame_count_local;
  UINT8 *data_local;
  
  _i = data;
  for (local_18 = 0; local_18 < frame_count; local_18 = local_18 + 1) {
    if (bit_depth == 0x18) {
      repack_int24le(_i,_i);
      repack_int24le(_i + 3,_i + 3);
    }
    else if (bit_depth == 0x20) {
      repack_int32le(_i,_i);
      repack_int32le(_i + 4,_i + 4);
    }
    else {
      repack_int16le(_i,_i);
      repack_int16le(_i + 2,_i + 2);
    }
    _i = _i + ((bit_depth >> 3) << 1);
  }
  return;
}

Assistant:

static void frames_to_little_endian(UINT8 *data, unsigned int frame_count) {
    unsigned int i = 0;
    while(i<frame_count) {
        switch(bit_depth) {
            case 32: {
                repack_int32le(&data[0], &data[0]);
                repack_int32le(&data[4], &data[4]);
                break;
            }
            case 24: {
                repack_int24le(&data[0], &data[0]);
                repack_int24le(&data[3], &data[3]);
                break;
            }
            default: /* 16 */ {
                repack_int16le(&data[0], &data[0]);
                repack_int16le(&data[2], &data[2]);
                break;
            }

        }
        i++;
        data += ((bit_depth / 8) * 2);
    }
}